

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O0

int Abc_IsopCountLits(Vec_Int_t *vCover,int nVars)

{
  int iVar1;
  uint uVar2;
  int local_30;
  int nLits;
  int Literal;
  int Entry;
  int k;
  int i;
  int nVars_local;
  Vec_Int_t *vCover_local;
  
  local_30 = 0;
  iVar1 = Vec_IntSize(vCover);
  if ((iVar1 == 0) ||
     ((iVar1 = Vec_IntSize(vCover), iVar1 == 1 && (iVar1 = Vec_IntEntry(vCover,0), iVar1 == 0)))) {
    vCover_local._4_4_ = 0;
  }
  else {
    for (Entry = 0; iVar1 = Vec_IntSize(vCover), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(vCover,Entry);
      for (Literal = 0; Literal < nVars; Literal = Literal + 1) {
        uVar2 = iVar1 >> ((byte)(Literal << 1) & 0x1f) & 3;
        if (uVar2 == 1) {
          local_30 = local_30 + 1;
        }
        else if (uVar2 == 2) {
          local_30 = local_30 + 1;
        }
        else if (uVar2 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilIsop.c"
                        ,0x26e,"int Abc_IsopCountLits(Vec_Int_t *, int)");
        }
      }
    }
    vCover_local._4_4_ = local_30;
  }
  return vCover_local._4_4_;
}

Assistant:

int Abc_IsopCountLits( Vec_Int_t * vCover, int nVars )
{
    int i, k, Entry, Literal, nLits = 0;
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover, 0) == 0) )
        return 0;
    Vec_IntForEachEntry( vCover, Entry, i )
    { 
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 ) // neg literal
                nLits++;
            else if ( Literal == 2 ) // pos literal
                nLits++;
            else if ( Literal != 0 ) 
                assert( 0 );
        }
    }
    return nLits;
}